

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O0

char * __thiscall
icu_63::LocalMemory<char>::allocateInsteadAndReset(LocalMemory<char> *this,int32_t newCapacity)

{
  char *p;
  int32_t newCapacity_local;
  LocalMemory<char> *this_local;
  
  if (newCapacity < 1) {
    this_local = (LocalMemory<char> *)0x0;
  }
  else {
    this_local = (LocalMemory<char> *)uprv_malloc_63((long)newCapacity);
    if (this_local != (LocalMemory<char> *)0x0) {
      memset(this_local,0,(long)newCapacity);
      uprv_free_63((this->super_LocalPointerBase<char>).ptr);
      (this->super_LocalPointerBase<char>).ptr = (char *)this_local;
    }
  }
  return (char *)this_local;
}

Assistant:

inline T *LocalMemory<T>::allocateInsteadAndReset(int32_t newCapacity) {
    if(newCapacity>0) {
        T *p=(T *)uprv_malloc(newCapacity*sizeof(T));
        if(p!=NULL) {
            uprv_memset(p, 0, newCapacity*sizeof(T));
            uprv_free(LocalPointerBase<T>::ptr);
            LocalPointerBase<T>::ptr=p;
        }
        return p;
    } else {
        return NULL;
    }
}